

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessOutput.cxx
# Opt level: O2

Encoding cmProcessOutput::FindEncoding(string *name)

{
  bool bVar1;
  Encoding EVar2;
  
  bVar1 = std::operator==(name,"UTF8");
  if (bVar1) {
    EVar2 = UTF8;
  }
  else {
    bVar1 = std::operator==(name,"NONE");
    EVar2 = None;
    if (!bVar1) {
      bVar1 = std::operator==(name,"ANSI");
      if (bVar1) {
        EVar2 = ANSI;
      }
      else {
        bVar1 = std::operator==(name,"OEM");
        EVar2 = (uint)bVar1 + (uint)bVar1 * 2 + Auto;
      }
    }
  }
  return EVar2;
}

Assistant:

cmProcessOutput::Encoding cmProcessOutput::FindEncoding(
  std::string const& name)
{
  Encoding encoding = Auto;
  if (name == "UTF8") {
    encoding = UTF8;
  } else if (name == "NONE") {
    encoding = None;
  } else if (name == "ANSI") {
    encoding = ANSI;
  } else if (name == "OEM") {
    encoding = OEM;
  }
  return encoding;
}